

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int read_data_stored(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  uint *puVar1;
  void *pvVar2;
  undefined8 uVar3;
  ssize_t *in_RCX;
  ulong *in_RDX;
  archive_read *in_RSI;
  archive *in_RDI;
  ssize_t bytes_avail;
  rar *rar;
  ulong local_38;
  int local_4;
  
  puVar1 = *(uint **)in_RDI[0x15].archive_format_name;
  if ((*(long *)(puVar1 + 0x28) == 0) && (((*puVar1 & 1) == 0 || ((puVar1[6] & 2) == 0)))) {
    (in_RSI->archive).magic = 0;
    (in_RSI->archive).state = 0;
    *in_RDX = 0;
    *in_RCX = *(ssize_t *)(puVar1 + 0x2c);
    if (*(long *)(puVar1 + 2) == *(long *)(puVar1 + 0x3a)) {
      *(undefined1 *)((long)puVar1 + 0xe5) = 1;
      local_4 = 1;
    }
    else {
      archive_set_error(in_RDI,0x54,"File CRC error");
      local_4 = -0x1e;
    }
  }
  else {
    pvVar2 = rar_read_ahead(in_RSI,(size_t)in_RDX,in_RCX);
    *(void **)&in_RSI->archive = pvVar2;
    if ((long)local_38 < 1) {
      archive_set_error(in_RDI,0x54,"Truncated RAR file data");
      local_4 = -0x1e;
    }
    else {
      *in_RDX = local_38;
      *in_RCX = *(ssize_t *)(puVar1 + 0x2c);
      *(ulong *)(puVar1 + 0x2c) = local_38 + *(long *)(puVar1 + 0x2c);
      *(ulong *)(puVar1 + 0x30) = local_38 + *(long *)(puVar1 + 0x30);
      *(ulong *)(puVar1 + 0x28) = *(long *)(puVar1 + 0x28) - local_38;
      *(ulong *)(puVar1 + 0x26) = local_38;
      uVar3._0_4_ = (in_RSI->archive).magic;
      uVar3._4_4_ = (in_RSI->archive).state;
      uVar3 = crc32(*(undefined8 *)(puVar1 + 0x3a),uVar3,local_38 & 0xffffffff);
      *(undefined8 *)(puVar1 + 0x3a) = uVar3;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int
read_data_stored(struct archive_read *a, const void **buff, size_t *size,
                 int64_t *offset)
{
  struct rar *rar;
  ssize_t bytes_avail;

  rar = (struct rar *)(a->format->data);
  if (rar->bytes_remaining == 0 &&
    !(rar->main_flags & MHD_VOLUME && rar->file_flags & FHD_SPLIT_AFTER))
  {
    *buff = NULL;
    *size = 0;
    *offset = rar->offset;
    if (rar->file_crc != rar->crc_calculated) {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                        "File CRC error");
      return (ARCHIVE_FATAL);
    }
    rar->entry_eof = 1;
    return (ARCHIVE_EOF);
  }

  *buff = rar_read_ahead(a, 1, &bytes_avail);
  if (bytes_avail <= 0)
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Truncated RAR file data");
    return (ARCHIVE_FATAL);
  }

  *size = bytes_avail;
  *offset = rar->offset;
  rar->offset += bytes_avail;
  rar->offset_seek += bytes_avail;
  rar->bytes_remaining -= bytes_avail;
  rar->bytes_unconsumed = bytes_avail;
  /* Calculate File CRC. */
  rar->crc_calculated = crc32(rar->crc_calculated, *buff,
    (unsigned)bytes_avail);
  return (ARCHIVE_OK);
}